

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::FileDescriptorProto::SharedCtor(FileDescriptorProto *this)

{
  string *psVar1;
  FileDescriptorProto *this_local;
  
  this->_cached_size_ = 0;
  psVar1 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault(&this->name_,psVar1);
  psVar1 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault(&this->package_,psVar1);
  psVar1 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  internal::ArenaStringPtr::UnsafeSetDefault(&this->syntax_,psVar1);
  memset(&this->options_,0,0x10);
  return;
}

Assistant:

void FileDescriptorProto::SharedCtor() {
  _cached_size_ = 0;
  name_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  package_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  syntax_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  ::memset(&options_, 0, reinterpret_cast<char*>(&source_code_info_) -
    reinterpret_cast<char*>(&options_) + sizeof(source_code_info_));
}